

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceSpot::~IfcLightSourceSpot(IfcLightSourceSpot *this)

{
  void *pvVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_IfcLightSourcePositional).super_IfcLightSource.
           super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
           _vptr_ObjectHelper[0xfffffffffffffffd];
  pvVar1 = &(this->super_IfcLightSourcePositional).super_IfcLightSource.field_0x40 + (long)p_Var2;
  *(undefined8 *)((long)pvVar1 + -0x40) = 0x96e0f8;
  *(undefined8 *)((long)pvVar1 + 0xb0) = 0x96e170;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x96e120;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x96e148;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  operator_delete((_func_int *)
                  ((long)&(this->super_IfcLightSourcePositional).super_IfcLightSource.
                          super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                          _vptr_ObjectHelper + (long)p_Var2));
  return;
}

Assistant:

IfcLightSourceSpot() : Object("IfcLightSourceSpot") {}